

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void launch_dec_workers(AV1Decoder *pbi,uint8_t *data_end,int num_workers)

{
  AVxWorkerInterface *pAVar1;
  AVxWorker *pAVar2;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  DecWorkerData *thread_data;
  AVxWorker *worker;
  int worker_idx;
  AVxWorkerInterface *winterface;
  int local_24;
  
  pAVar1 = aom_get_worker_interface();
  for (local_24 = in_EDX + -1; -1 < local_24; local_24 = local_24 + -1) {
    pAVar2 = (AVxWorker *)(*(long *)(in_RDI + 0xa120) + (long)local_24 * 0x38);
    *(undefined8 *)((long)pAVar2->data1 + 8) = in_RSI;
    pAVar2->had_error = 0;
    if (local_24 == 0) {
      (*pAVar1->execute)(pAVar2);
    }
    else {
      (*pAVar1->launch)(pAVar2);
    }
  }
  return;
}

Assistant:

static inline void launch_dec_workers(AV1Decoder *pbi, const uint8_t *data_end,
                                      int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();

  for (int worker_idx = num_workers - 1; worker_idx >= 0; --worker_idx) {
    AVxWorker *const worker = &pbi->tile_workers[worker_idx];
    DecWorkerData *const thread_data = (DecWorkerData *)worker->data1;

    thread_data->data_end = data_end;

    worker->had_error = 0;
    if (worker_idx == 0) {
      winterface->execute(worker);
    } else {
      winterface->launch(worker);
    }
  }
}